

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::hufDecode(longlong *hcode,HufDec *hdecod,char *in,int ni,int rlc,int no,
                       unsigned_short *out)

{
  ulong uVar1;
  unsigned_short *ob;
  bool bVar2;
  int iVar3;
  uint uVar4;
  unsigned_short *oe_00;
  byte *in_end;
  longlong lVar5;
  ulong uVar6;
  uint local_90;
  HufDec pl_1;
  int i;
  int l;
  uint j;
  HufDec pl;
  char *ie;
  unsigned_short *oe;
  unsigned_short *outb;
  ulong uStack_40;
  int lc;
  longlong c;
  int local_30;
  int no_local;
  int rlc_local;
  int ni_local;
  char *in_local;
  HufDec *hdecod_local;
  longlong *hcode_local;
  
  ob = out;
  uStack_40 = 0;
  outb._4_4_ = 0;
  oe_00 = out + no;
  in_end = (byte *)(in + (ni + 7) / 8);
  c._4_4_ = no;
  local_30 = rlc;
  no_local = ni;
  _rlc_local = (byte *)in;
  in_local = (char *)hdecod;
  hdecod_local = (HufDec *)hcode;
  do {
    if (in_end <= _rlc_local) {
      uVar4 = 8U - no_local & 7;
      uStack_40 = (long)uStack_40 >> (sbyte)uVar4;
      outb._4_4_ = outb._4_4_ - uVar4;
      while( true ) {
        if (outb._4_4_ < 1) {
          if ((long)out - (long)ob >> 1 != (long)c._4_4_) {
            return false;
          }
          return true;
        }
        local_90 = (uint)*(ulong *)(in_local +
                                   (uStack_40 << (0xeU - (char)outb._4_4_ & 0x3f) & 0x3fff) * 0x10);
        if ((*(ulong *)(in_local + (uStack_40 << (0xeU - (char)outb._4_4_ & 0x3f) & 0x3fff) * 0x10)
            & 0xff) == 0) break;
        outb._4_4_ = outb._4_4_ - (local_90 & 0xff);
        bVar2 = getCode(local_90 >> 8,local_30,(longlong *)&stack0xffffffffffffffc0,
                        (int *)((long)&outb + 4),(char **)&rlc_local,(char *)in_end,&out,ob,oe_00);
        if (!bVar2) {
          return false;
        }
      }
      return false;
    }
    uStack_40 = uStack_40 << 8 | (ulong)*_rlc_local;
    outb._4_4_ = outb._4_4_ + 8;
    _rlc_local = _rlc_local + 1;
    while (0xd < outb._4_4_) {
      uVar6 = *(ulong *)(in_local +
                        ((long)uStack_40 >> ((char)outb._4_4_ - 0xeU & 0x3f) & 0x3fffU) * 0x10);
      uVar1 = *(ulong *)((long)(in_local +
                               ((long)uStack_40 >> ((char)outb._4_4_ - 0xeU & 0x3f) & 0x3fffU) *
                               0x10) + 8);
      l = (int)uVar6;
      if ((uVar6 & 0xff) == 0) {
        if (uVar1 == 0) {
          return false;
        }
        for (i = 0; (uint)i < (uint)l >> 8; i = i + 1) {
          lVar5 = hufLength(*(longlong *)
                             (&hdecod_local->field_0x0 +
                             (ulong)*(uint *)(uVar1 + (ulong)(uint)i * 4) * 8));
          iVar3 = (int)lVar5;
          for (; outb._4_4_ < iVar3 && _rlc_local < in_end; outb._4_4_ = outb._4_4_ + 8) {
            uStack_40 = uStack_40 << 8 | (ulong)*_rlc_local;
            _rlc_local = _rlc_local + 1;
          }
          if ((iVar3 <= outb._4_4_) &&
             (uVar6 = hufCode(*(longlong *)
                               (&hdecod_local->field_0x0 +
                               (ulong)*(uint *)(uVar1 + (ulong)(uint)i * 4) * 8)),
             uVar6 == ((long)uStack_40 >> ((char)outb._4_4_ - (byte)lVar5 & 0x3f) &
                      (1L << ((byte)lVar5 & 0x3f)) - 1U))) {
            outb._4_4_ = outb._4_4_ - iVar3;
            bVar2 = getCode(*(int *)(uVar1 + (ulong)(uint)i * 4),local_30,
                            (longlong *)&stack0xffffffffffffffc0,(int *)((long)&outb + 4),
                            (char **)&rlc_local,(char *)in_end,&out,ob,oe_00);
            if (!bVar2) {
              return false;
            }
            break;
          }
        }
        if (i == (uint)l >> 8) {
          return false;
        }
      }
      else {
        outb._4_4_ = outb._4_4_ - (l & 0xffU);
        bVar2 = getCode((uint)l >> 8,local_30,(longlong *)&stack0xffffffffffffffc0,
                        (int *)((long)&outb + 4),(char **)&rlc_local,(char *)in_end,&out,ob,oe_00);
        if (!bVar2) {
          return false;
        }
      }
    }
  } while( true );
}

Assistant:

static bool hufDecode(const long long *hcode,  // i : encoding table
                      const HufDec *hdecod,    // i : decoding table
                      const char *in,          // i : compressed input buffer
                      int ni,                  // i : input size (in bits)
                      int rlc,                 // i : run-length code
                      int no,  // i : expected output size (in bytes)
                      unsigned short *out)  //  o: uncompressed output buffer
{
  long long c = 0;
  int lc = 0;
  unsigned short *outb = out;          // begin
  unsigned short *oe = out + no;       // end
  const char *ie = in + (ni + 7) / 8;  // input byte size

  //
  // Loop on input bytes
  //

  while (in < ie) {
    getChar(c, lc, in);

    //
    // Access decoding table
    //

    while (lc >= HUF_DECBITS) {
      const HufDec pl = hdecod[(c >> (lc - HUF_DECBITS)) & HUF_DECMASK];

      if (pl.len) {
        //
        // Get short code
        //

        lc -= pl.len;
        // std::cout << "lit = " << pl.lit << std::endl;
        // std::cout << "rlc = " << rlc << std::endl;
        // std::cout << "c = " << c << std::endl;
        // std::cout << "lc = " << lc << std::endl;
        // std::cout << "in = " << in << std::endl;
        // std::cout << "out = " << out << std::endl;
        // std::cout << "oe = " << oe << std::endl;
        if (!getCode(pl.lit, rlc, c, lc, in, ie, out, outb, oe)) {
          return false;
        }
      } else {
        if (!pl.p) {
          return false;
        }
        // invalidCode(); // wrong code

        //
        // Search long code
        //

        unsigned int j;

        for (j = 0; j < pl.lit; j++) {
          int l = hufLength(hcode[pl.p[j]]);

          while (lc < l && in < ie)  // get more bits
            getChar(c, lc, in);

          if (lc >= l) {
            if (hufCode(hcode[pl.p[j]]) ==
                ((c >> (lc - l)) & (((long long)(1) << l) - 1))) {
              //
              // Found : get long code
              //

              lc -= l;
              if (!getCode(pl.p[j], rlc, c, lc, in, ie, out, outb, oe)) {
                return false;
              }
              break;
            }
          }
        }

        if (j == pl.lit) {
          return false;
          // invalidCode(); // Not found
        }
      }
    }
  }

  //
  // Get remaining (short) codes
  //

  int i = (8 - ni) & 7;
  c >>= i;
  lc -= i;

  while (lc > 0) {
    const HufDec pl = hdecod[(c << (HUF_DECBITS - lc)) & HUF_DECMASK];

    if (pl.len) {
      lc -= pl.len;
      if (!getCode(pl.lit, rlc, c, lc, in, ie, out, outb, oe)) {
        return false;
      }
    } else {
      return false;
      // invalidCode(); // wrong (long) code
    }
  }

  if (out - outb != no) {
    return false;
  }
  // notEnoughData ();

  return true;
}